

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool last_connection,bool *connection_close)

{
  bool bVar1;
  __ssize_t _Var2;
  _Alloc_hider *p_Var3;
  long lVar4;
  undefined7 in_register_00000011;
  Headers *headers;
  int iVar5;
  string boundary;
  stream_line_reader reader;
  Response res;
  Request req;
  char buf [2048];
  string local_ae8;
  string local_ac8;
  undefined1 local_aa8 [32];
  _Alloc_hider local_a88;
  size_type local_a80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a78;
  _Any_data local_a68;
  undefined8 local_a58;
  undefined8 uStack_a50;
  Response local_a40;
  undefined1 local_9a8 [136];
  _Rb_tree_node_base local_920;
  size_t local_900;
  string local_8f8;
  Params local_8d8;
  MultipartFiles local_8a8;
  pointer psStack_878;
  pointer local_870;
  pointer psStack_868;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_860;
  _Any_data _Stack_858;
  _Manager_type p_Stack_848;
  _Invoker_type local_840;
  char local_838 [2056];
  
  local_aa8._8_8_ = local_838;
  local_aa8._16_8_ = 0x800;
  local_a88._M_p = (pointer)&local_a78;
  local_a80 = 0;
  local_a78._M_local_buf[0] = '\0';
  local_aa8._0_8_ = strm;
  _Var2 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_aa8,(char **)strm,
                     (size_t *)CONCAT71(in_register_00000011,last_connection),
                     (FILE *)connection_close);
  if ((char)_Var2 == '\0') goto LAB_00159cba;
  local_9a8._0_8_ = local_9a8 + 0x10;
  local_9a8._8_8_ = 0;
  local_9a8[0x10] = '\0';
  local_9a8._32_8_ = local_9a8 + 0x30;
  local_9a8._40_8_ = 0;
  local_9a8[0x30] = '\0';
  local_9a8._64_8_ = local_9a8 + 0x50;
  local_9a8._72_8_ = 0;
  local_9a8[0x50] = '\0';
  local_9a8._96_8_ = local_9a8 + 0x70;
  local_9a8._104_8_ = 0;
  local_9a8[0x70] = '\0';
  local_920._M_left = &local_920;
  local_920._M_color = _S_red;
  local_920._M_parent = (_Base_ptr)0x0;
  local_900 = 0;
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  local_8f8._M_string_length = 0;
  local_8f8.field_2._M_local_buf[0] = '\0';
  local_8d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8d8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8a8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_840 = (_Invoker_type)0x0;
  local_a40.version._M_dataplus._M_p = (pointer)&local_a40.version.field_2;
  local_a40.version._M_string_length = 0;
  local_a40.version.field_2._M_local_buf[0] = '\0';
  local_a40.status = -1;
  local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_858._8_8_ = 0;
  p_Stack_848 = (_Manager_type)0x0;
  local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_860._M_current = (char *)0x0;
  _Stack_858._M_unused._M_object = (void *)0x0;
  local_870 = (pointer)0x0;
  psStack_868 = (pointer)0x0;
  local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a40.body._M_dataplus._M_p = (pointer)&local_a40.body.field_2;
  local_a40.body._M_string_length = 0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psStack_878 = (pointer)0x0;
  local_a40.body.field_2._M_local_buf[0] = '\0';
  local_a40.streamcb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a40.streamcb.super__Function_base._M_functor._8_8_ = 0;
  local_a40.streamcb.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a40.streamcb._M_invoker = (_Invoker_type)0x0;
  local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a40.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_920._M_right = local_920._M_left;
  local_8d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::assign((char *)&local_a40);
  p_Var3 = (_Alloc_hider *)(local_aa8 + 8);
  if (local_a80 != 0) {
    p_Var3 = &local_a88;
  }
  bVar1 = parse_request_line(this,p_Var3->_M_p,(Request *)local_9a8);
  iVar5 = 400;
  if ((bVar1) &&
     (bVar1 = detail::read_headers((detail *)strm,(Stream *)(local_9a8 + 0x80),headers), bVar1)) {
    Request::get_header_value_abi_cxx11_(&local_ae8,(Request *)local_9a8,"Connection",0);
    bVar1 = std::operator==(&local_ae8,"close");
    std::__cxx11::string::~string((string *)&local_ae8);
    if (bVar1) {
      *connection_close = true;
    }
    (*strm->_vptr_Stream[5])(&local_ae8,strm);
    Request::set_header((Request *)local_9a8,"REMOTE_ADDR",local_ae8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_ae8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_9a8 + 0x20),"POST");
    if ((!bVar1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_9a8 + 0x20),"PUT"), !bVar1)) {
LAB_00159c49:
      bVar1 = routing(this,(Request *)local_9a8,&local_a40);
      iVar5 = 0x194;
      if ((bVar1) && (iVar5 = local_a40.status, local_a40.status == -1)) {
        iVar5 = 200;
      }
      goto LAB_00159c80;
    }
    local_a58 = 0;
    uStack_a50 = 0;
    local_a68._M_unused._M_object = (void *)0x0;
    local_a68._8_8_ = 0;
    bVar1 = detail::read_content<httplib::Request>(strm,(Request *)local_9a8,(Progress *)&local_a68)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_a68);
    if (!bVar1) goto LAB_00159c80;
    Request::get_header_value_abi_cxx11_(&local_ae8,(Request *)local_9a8,"Content-Type",0);
    Request::get_header_value_abi_cxx11_(&local_ac8,(Request *)local_9a8,"Content-Encoding",0);
    bVar1 = std::operator==(&local_ac8,"gzip");
    std::__cxx11::string::~string((string *)&local_ac8);
    if (!bVar1) {
      lVar4 = std::__cxx11::string::find((char *)&local_ae8,0x16e4f5);
      if (lVar4 == 0) {
        detail::parse_query_text(&local_8f8,&local_8d8);
      }
      else {
        lVar4 = std::__cxx11::string::find((char *)&local_ae8,0x16e517);
        if (lVar4 == 0) {
          local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
          local_ac8._M_string_length = 0;
          local_ac8.field_2._M_local_buf[0] = '\0';
          bVar1 = detail::parse_multipart_boundary(&local_ae8,&local_ac8);
          if ((!bVar1) ||
             (bVar1 = detail::parse_multipart_formdata(&local_ac8,&local_8f8,&local_8a8), !bVar1)) {
            local_a40.status = 400;
            write_response(this,strm,last_connection,(Request *)local_9a8,&local_a40);
            std::__cxx11::string::~string((string *)&local_ac8);
            goto LAB_00159b8d;
          }
          std::__cxx11::string::~string((string *)&local_ac8);
        }
      }
      std::__cxx11::string::~string((string *)&local_ae8);
      goto LAB_00159c49;
    }
    local_a40.status = 0x19f;
    write_response(this,strm,last_connection,(Request *)local_9a8,&local_a40);
LAB_00159b8d:
    std::__cxx11::string::~string((string *)&local_ae8);
  }
  else {
LAB_00159c80:
    local_a40.status = iVar5;
    write_response(this,strm,last_connection,(Request *)local_9a8,&local_a40);
  }
  Response::~Response(&local_a40);
  Request::~Request((Request *)local_9a8);
LAB_00159cba:
  std::__cxx11::string::~string((string *)&local_a88);
  return (bool)(char)_Var2;
}

Assistant:

inline bool Server::process_request(Stream& strm, bool last_connection, bool& connection_close)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

    detail::stream_line_reader reader(strm, buf, bufsiz);

    // Connection has been closed on client
    if (!reader.getline()) {
        return false;
    }

    Request req;
    Response res;

    res.version = "HTTP/1.1";

    // Request line and headers
    if (!parse_request_line(reader.ptr(), req) || !detail::read_headers(strm, req.headers)) {
        res.status = 400;
        write_response(strm, last_connection, req, res);
        return true;
    }

    if (req.get_header_value("Connection") == "close") {
        connection_close = true;
    }

    req.set_header("REMOTE_ADDR", strm.get_remote_addr().c_str());

    // Body
    if (req.method == "POST" || req.method == "PUT") {
        if (!detail::read_content(strm, req)) {
            res.status = 400;
            write_response(strm, last_connection, req, res);
            return true;
        }

        const auto& content_type = req.get_header_value("Content-Type");

        if (req.get_header_value("Content-Encoding") == "gzip") {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
            detail::decompress(req.body);
#else
            res.status = 415;
            write_response(strm, last_connection, req, res);
            return true;
#endif
        }

        if (!content_type.find("application/x-www-form-urlencoded")) {
            detail::parse_query_text(req.body, req.params);
        } else if(!content_type.find("multipart/form-data")) {
            std::string boundary;
            if (!detail::parse_multipart_boundary(content_type, boundary) ||
                !detail::parse_multipart_formdata(boundary, req.body, req.files)) {
                res.status = 400;
                write_response(strm, last_connection, req, res);
                return true;
            }
        }
    }

    if (routing(req, res)) {
        if (res.status == -1) {
            res.status = 200;
        }
    } else {
        res.status = 404;
    }

    write_response(strm, last_connection, req, res);
    return true;
}